

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AStarFringe.cpp
# Opt level: O2

bool __thiscall AStarFringe::insertInFringe(AStarFringe *this,sptr *node)

{
  unordered_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  *this_00;
  Heuristic *pHVar1;
  bool bVar2;
  Board *pBVar3;
  vector<Direction,_std::allocator<Direction>_> *pvVar4;
  mapped_type *pmVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  size_t hash;
  size_t local_40;
  value_type local_38;
  
  pBVar3 = SearchNode::getBoard
                     ((node->super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  local_40 = Board::hash(pBVar3);
  pvVar4 = SearchNode::getPath((node->super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr);
  lVar6 = (long)(pvVar4->super__Vector_base<Direction,_std::allocator<Direction>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar4->super__Vector_base<Direction,_std::allocator<Direction>_>)._M_impl.
                super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 2;
  auVar9._8_4_ = (int)(lVar6 >> 0x22);
  auVar9._0_8_ = lVar7;
  auVar9._12_4_ = 0x45300000;
  pHVar1 = this->heuristic;
  pBVar3 = SearchNode::getBoard
                     ((node->super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  dVar8 = (*pHVar1)(pBVar3);
  dVar8 = dVar8 + (auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
  this_00 = &this->leastCosts;
  pBVar3 = SearchNode::getBoard
                     ((node->super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  local_38.node.super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)Board::hash(pBVar3);
  bVar2 = std::
          unordered_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
          ::contains(this_00,(key_type *)&local_38);
  if ((bVar2) &&
     (pmVar5 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::allocator<std::pair<const_unsigned_long,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::allocator<std::pair<const_unsigned_long,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_40), *pmVar5 <= dVar8)) {
    return false;
  }
  std::__shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2> *)&local_38,
             &node->super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>);
  local_38.cost = dVar8;
  std::
  priority_queue<AStarFringe::Node,_std::vector<AStarFringe::Node,_std::allocator<AStarFringe::Node>_>,_std::greater<AStarFringe::Node>_>
  ::push(&this->fringe,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.node.super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pmVar5 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::allocator<std::pair<const_unsigned_long,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::allocator<std::pair<const_unsigned_long,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_40);
  *pmVar5 = dVar8;
  return true;
}

Assistant:

bool AStarFringe::insertInFringe(const SearchNode::sptr& node) {
    size_t hash = node->getBoard().hash();
    double cost = node->getPath().size() + heuristic(node->getBoard());

    if (leastCosts.contains(node->getBoard().hash())) {
        double leastNodeCost = leastCosts[hash];

        if (leastNodeCost <= cost) {
            // Already seen a cheaper node with the same board state, discard
            return false;
        }
    }

    fringe.push({ node, cost });
    leastCosts[hash] = cost;

    return true;
}